

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::compile_ite_expression
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_expression_t *cond,typed_expression_t *then_value,
          typed_expression_t *else_value)

{
  size_type sVar1;
  vector<long,_std::allocator<long>_> local_c8;
  size_type local_b0 [2];
  vector<long,_std::allocator<long>_> local_a0;
  long local_88;
  value_type_conflict2 local_80;
  size_type local_78;
  size_type else_len;
  vector<long,_std::allocator<long>_> else_bytecode;
  size_type then_len;
  vector<long,_std::allocator<long>_> then_bytecode;
  typed_expression_t *else_value_local;
  typed_expression_t *then_value_local;
  typed_expression_t *cond_local;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  then_bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)else_value;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&then_len)
  ;
  sVar1 = compile_tmp_rvalue_expression(then_value,(vector<long,_std::allocator<long>_> *)&then_len)
  ;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&else_len)
  ;
  local_78 = compile_tmp_rvalue_expression
                       ((typed_expression_t *)
                        then_bytecode.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (vector<long,_std::allocator<long>_> *)&else_len);
  (**(code **)(*(long *)cond + 0x30))(cond,this);
  local_80 = 4;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_80);
  local_88 = sVar1 + 2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_88);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_a0,(vector<long,_std::allocator<long>_> *)&then_len);
  append_bytecode<std::back_insert_iterator<std::vector<long,std::allocator<long>>>>
            (&this->_bytecode_back_inserter,&local_a0);
  std::vector<long,_std::allocator<long>_>::~vector(&local_a0);
  local_b0[1] = 3;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict2 *)(local_b0 + 1));
  local_b0[0] = local_78;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict2 *)local_b0);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_c8,(vector<long,_std::allocator<long>_> *)&else_len);
  append_bytecode<std::back_insert_iterator<std::vector<long,std::allocator<long>>>>
            (&this->_bytecode_back_inserter,&local_c8);
  std::vector<long,_std::allocator<long>_>::~vector(&local_c8);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&else_len);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&then_len);
  return;
}

Assistant:

void compile_ite_expression(tchecker::typed_expression_t const & cond, tchecker::typed_expression_t const & then_value,
                              tchecker::typed_expression_t const & else_value)
  {
    // pre-compute 'then' and 'else' bytecodes
    std::vector<tchecker::bytecode_t> then_bytecode;
    auto then_len = compile_tmp_rvalue_expression(then_value, then_bytecode);

    std::vector<tchecker::bytecode_t> else_bytecode;
    auto else_len = compile_tmp_rvalue_expression(else_value, else_bytecode);

    // generation of ite bytecode
    //  - insert guard bytecode
    cond.visit(*this);

    //  - insert a conditional jump over 'then' bytecode. Jump instruction
    //    move IP relatively to the address following the JMP.
    _bytecode_back_inserter = tchecker::VM_JMPZ;
    _bytecode_back_inserter = then_len + 2;

    //  - insert bytecode for the 'then' statement
    append_bytecode(_bytecode_back_inserter, then_bytecode);

    //  - insert a jump over 'else' bytecode.
    _bytecode_back_inserter = tchecker::VM_JMP;
    _bytecode_back_inserter = else_len;

    //  - insert bytecode for the 'else' statement
    append_bytecode(_bytecode_back_inserter, else_bytecode);
  }